

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O3

Result __thiscall
wabt::anon_unknown_15::BinaryReaderObjdump::OnStartFunction
          (BinaryReaderObjdump *this,Index func_index)

{
  string_view sVar1;
  
  if (((this->super_BinaryReaderObjdumpBase).options_)->mode == Headers) {
    printf("start: %u\n",func_index);
  }
  else {
    PrintDetails(this," - start function: %u",func_index);
    sVar1 = ObjdumpNames::Get(&((this->super_BinaryReaderObjdumpBase).objdump_state_)->
                               function_names,func_index);
    if (sVar1._M_len != 0) {
      PrintDetails(this," <%.*s>",(ulong)(uint)sVar1._M_len,sVar1._M_str);
    }
    PrintDetails(this,"\n");
  }
  return (Result)Ok;
}

Assistant:

Result BinaryReaderObjdump::OnStartFunction(Index func_index) {
  if (options_->mode == ObjdumpMode::Headers) {
    printf("start: %" PRIindex "\n", func_index);
  } else {
    PrintDetails(" - start function: %" PRIindex, func_index);
    auto name = GetFunctionName(func_index);
    if (!name.empty()) {
      PrintDetails(" <" PRIstringview ">", WABT_PRINTF_STRING_VIEW_ARG(name));
    }
    PrintDetails("\n");
  }
  return Result::Ok;
}